

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar5.c
# Opt level: O2

void test_read_format_rar5_compressed(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a;
  char *v2;
  time_t tVar3;
  la_int64_t v2_00;
  la_ssize_t lVar4;
  archive_entry *ae;
  uint8_t buff [1200];
  archive_entry *local_4e0;
  uint8_t local_4d8 [1208];
  
  extract_reference_file("test_read_format_rar5_compressed.rar");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'¢',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'¢',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'¢',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",a);
  wVar2 = archive_read_open_filename(a,"test_read_format_rar5_compressed.rar",0x2800);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'¢',(uint)(wVar2 == L'\0'),
                   "0 == archive_read_open_filename(a, \"test_read_format_rar5_compressed.rar\", 10240)"
                   ,a);
  iVar1 = archive_read_next_header((archive *)a,&local_4e0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'¤',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  v2 = archive_entry_pathname(local_4e0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
             ,L'¥',"test.bin","\"test.bin\"",v2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar3 = archive_entry_mtime(local_4e0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'¦',(uint)(0 < (int)tVar3),"(int) archive_entry_mtime(ae) > 0",a);
  v2_00 = archive_entry_size(local_4e0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'§',0x4b0,"DATA_SIZE",v2_00,"archive_entry_size(ae)",(void *)0x0);
  lVar4 = archive_read_data((archive *)a,local_4d8,0x4b0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'¨',(uint)(lVar4 == 0x4b0),
                   "DATA_SIZE == archive_read_data(a, buff, DATA_SIZE)",a);
  iVar1 = archive_read_next_header((archive *)a,&local_4e0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'©',(uint)(iVar1 == 1),"ARCHIVE_EOF == archive_read_next_header(a, &ae)",a);
  iVar1 = verify_data(local_4d8,0,0x4b0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ª',(uint)(iVar1 == 1),"1 == verify_data(buff, 0, DATA_SIZE)",a);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'¬',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'¬',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_rar5_compressed)
{
	const int DATA_SIZE = 1200;
	uint8_t buff[1200];

	PROLOGUE("test_read_format_rar5_compressed.rar");

	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString("test.bin", archive_entry_pathname(ae));
	assertA((int) archive_entry_mtime(ae) > 0);
	assertEqualInt(DATA_SIZE, archive_entry_size(ae));
	assertA(DATA_SIZE == archive_read_data(a, buff, DATA_SIZE));
	assertA(ARCHIVE_EOF == archive_read_next_header(a, &ae));
	assertA(1 == verify_data(buff, 0, DATA_SIZE));

	EPILOGUE();
}